

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_funck(lua_State *L)

{
  int32_t iVar1;
  GCproto *pGVar2;
  ulong uVar3;
  
  pGVar2 = check_Lproto(L,0);
  iVar1 = lj_lib_checkint(L,2);
  uVar3 = (ulong)iVar1;
  if (iVar1 < 0) {
    if ((long)(ulong)pGVar2->sizekgc <= (long)~uVar3) {
      return 0;
    }
    uVar3 = *(ulong *)((pGVar2->k).ptr64 + uVar3 * 8);
    L->top[-1].u64 = (ulong)~(uint)*(byte *)(uVar3 + 9) << 0x2f | uVar3;
  }
  else {
    if ((long)(ulong)pGVar2->sizekn <= (long)uVar3) {
      return 0;
    }
    L->top[-1] = *(TValue *)((pGVar2->k).ptr64 + uVar3 * 8);
  }
  return 1;
}

Assistant:

LJLIB_CF(jit_util_funck)
{
  GCproto *pt = check_Lproto(L, 0);
  ptrdiff_t idx = (ptrdiff_t)lj_lib_checkint(L, 2);
  if (idx >= 0) {
    if (idx < (ptrdiff_t)pt->sizekn) {
      copyTV(L, L->top-1, proto_knumtv(pt, idx));
      return 1;
    }
  } else {
    if (~idx < (ptrdiff_t)pt->sizekgc) {
      GCobj *gc = proto_kgc(pt, idx);
      setgcV(L, L->top-1, gc, ~gc->gch.gct);
      return 1;
    }
  }
  return 0;
}